

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genData.hpp
# Opt level: O2

pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *
genPointPair<float>(pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>
                    *__return_storage_ptr__,Matrix<float,_4,_4,_0,_4,_4> *T)

{
  RandomReturnType local_6b;
  Matrix<float,_4,_1,_0,_4,_1> Q;
  undefined1 local_58 [16];
  float local_48 [2];
  float afStack_40 [5];
  Matrix<float,_3,_1,_0,_3,_1> P;
  
  Eigen::DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::Random(&local_6b,3);
  Q.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       5.60519e-44;
  Eigen::
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<float>,Eigen::Matrix<float,3,1,0,3,1>>>
  ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<float>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
               *)local_58,
              (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<float>,Eigen::Matrix<float,3,1,0,3,1>>>
               *)&local_6b,(int *)&Q);
  Eigen::PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<float>,Eigen::Matrix<float,3,1,0,3,1>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,3,1,0,3,1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>> *)&P,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<float>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>_>
              *)local_58);
  local_58._0_8_ = T;
  local_58._8_8_ = (PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>> *)&P;
  Eigen::PlainObjectBase<Eigen::Matrix<float,4,1,0,4,1>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<float,4,4,0,4,4>,Eigen::Homogeneous<Eigen::Matrix<float,3,1,0,3,1>,0>,0>>
            ((PlainObjectBase<Eigen::Matrix<float,4,1,0,4,1>> *)&Q,
             (DenseBase<Eigen::Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Homogeneous<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0>,_0>_>
              *)local_58);
  local_48[1] = Q.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
                [1];
  local_48[0] = Q.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
                [0];
  afStack_40[0] =
       Q.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2];
  afStack_40[1] =
       Q.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3];
  local_58._0_8_ = (PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>> *)&P;
  std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::
  pair<Eigen::Homogeneous<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>,_true>
            (__return_storage_ptr__,
             (pair<Eigen::Homogeneous<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>
              *)local_58);
  return __return_storage_ptr__;
}

Assistant:

std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>> genPointPair(Eigen::Matrix<floatPrec,4,4> T){
    
    // get a random 3D point (in homogenous coordinates)
    Eigen::Matrix<floatPrec,3,1> P = Eigen::Matrix<floatPrec, 3, 1>::Random(3) * int(POINTSWITHINCUBE);
    // requires as input the pose between the two 3D scans,
    // to apply the respective transformation to the
    // point in RefB
    
    Eigen::Matrix<floatPrec,4,1> Q = T * P.homogeneous();

    return std::make_pair(P.homogeneous(),Q);
}